

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall amrex::AmrLevel::removeOldData(AmrLevel *this)

{
  int iVar1;
  int i;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  lVar2 = 0;
  while( true ) {
    iVar1 = DescriptorList::size((DescriptorList *)desc_lst);
    if (iVar1 <= lVar2) break;
    StateData::removeOldData
              ((StateData *)
               ((long)&(((this->state).
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         _M_impl.super__Vector_impl_data._M_start)->domain).smallend + lVar3 + -0x10
               ));
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0xe0;
  }
  return;
}

Assistant:

void
AmrLevel::removeOldData ()
{
    for (int i = 0; i < desc_lst.size(); i++)
    {
        state[i].removeOldData();
    }
}